

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

GuardBuilder * __thiscall
r_exec::CTPX::find_guard_builder(CTPX *this,_Fact *cause,_Fact *consequent,uint64_t period)

{
  _Object *p_Var1;
  byte bVar2;
  char cVar3;
  short sVar4;
  uint16_t uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 *puVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint64_t uVar9;
  uint64_t uVar10;
  SGuardBuilder *this_00;
  uint16_t cmd_arg_index;
  Atom *this_01;
  ushort uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  Atom s_2;
  Atom s_1;
  Atom s;
  undefined4 local_4c;
  double local_48;
  undefined4 local_40;
  undefined4 local_3c;
  uint64_t local_38;
  long *plVar7;
  
  iVar6 = (*(cause->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(cause,0);
  plVar7 = (long *)CONCAT44(extraout_var,iVar6);
  (**(code **)(*plVar7 + 0x20))(plVar7,0);
  sVar4 = r_code::Atom::asOpcode();
  if (sVar4 == Opcodes::Cmd) {
    p_Var1 = (this->super__TPX).super_TPX.target.object;
    local_38 = period;
    iVar6 = (*p_Var1->_vptr__Object[9])(p_Var1,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x20))
              ((long *)CONCAT44(extraout_var_00,iVar6),3);
    fVar13 = (float)r_code::Atom::asFloat();
    iVar6 = (*(consequent->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object._vptr__Object[9])(consequent,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x20))
              ((long *)CONCAT44(extraout_var_01,iVar6),3);
    fVar14 = (float)r_code::Atom::asFloat();
    (**(code **)(*plVar7 + 0x20))(plVar7,2);
    uVar5 = r_code::Atom::asIndex();
    (**(code **)(*plVar7 + 0x20))(plVar7,uVar5);
    bVar2 = r_code::Atom::getAtomCount();
    uVar11 = (ushort)bVar2;
    if (bVar2 != 0) {
      local_48 = (double)(fVar14 - fVar13);
      cmd_arg_index = uVar5;
      do {
        cmd_arg_index = cmd_arg_index + 1;
        puVar8 = (undefined4 *)(**(code **)(*plVar7 + 0x20))(plVar7,cmd_arg_index);
        local_3c = *puVar8;
        cVar3 = r_code::Atom::isFloat();
        if (cVar3 != '\0') {
          fVar15 = (float)r_code::Atom::asFloat();
          cVar3 = r_code::Utils::Equal((double)fVar15,local_48);
          if (cVar3 != '\0') {
            this_00 = (SGuardBuilder *)operator_new(0x20);
            ACGuardBuilder::ACGuardBuilder((ACGuardBuilder *)this_00,local_38,cmd_arg_index);
            this_01 = (Atom *)&local_3c;
            goto LAB_0019437e;
          }
        }
        r_code::Atom::~Atom((Atom *)&local_3c);
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      if ((ushort)(uVar5 + 1) <= (ushort)bVar2) {
        local_48 = (double)(fVar14 / fVar13);
        uVar11 = uVar5 + 1;
        do {
          puVar8 = (undefined4 *)(**(code **)(*plVar7 + 0x20))(plVar7,uVar11);
          local_40 = *puVar8;
          cVar3 = r_code::Atom::isFloat();
          if (cVar3 != '\0') {
            fVar13 = (float)r_code::Atom::asFloat();
            cVar3 = r_code::Utils::Equal((double)fVar13,local_48);
            if (cVar3 != '\0') {
              this_00 = (SGuardBuilder *)operator_new(0x20);
              MCGuardBuilder::MCGuardBuilder((MCGuardBuilder *)this_00,local_38,(double)uVar11);
              this_01 = (Atom *)&local_40;
              goto LAB_0019437e;
            }
          }
          r_code::Atom::~Atom((Atom *)&local_40);
          bVar12 = uVar11 == bVar2;
          uVar11 = uVar11 + 1;
          if (bVar12) {
            return (GuardBuilder *)(SGuardBuilder *)0x0;
          }
        } while( true );
      }
    }
  }
  else if (sVar4 == Opcodes::MkVal) {
    puVar8 = (undefined4 *)(**(code **)(*plVar7 + 0x20))(plVar7,3);
    local_4c = *puVar8;
    cVar3 = r_code::Atom::isFloat();
    if (cVar3 != '\0') {
      fVar13 = (float)r_code::Atom::asFloat();
      p_Var1 = (this->super__TPX).super_TPX.target.object;
      iVar6 = (*p_Var1->_vptr__Object[9])(p_Var1,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x20))
                ((long *)CONCAT44(extraout_var_02,iVar6),3);
      uVar16 = r_code::Atom::asFloat();
      local_48 = (double)CONCAT44(local_48._4_4_,uVar16);
      iVar6 = (*(consequent->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object._vptr__Object[9])(consequent,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x20))
                ((long *)CONCAT44(extraout_var_03,iVar6),3);
      fVar14 = (float)r_code::Atom::asFloat();
      fVar15 = fVar14 - local_48._0_4_;
      cVar3 = r_code::Utils::Equal((double)fVar13,(double)(fVar15 / (float)period));
      if (cVar3 == '\0') {
        if ((local_48._0_4_ != 0.0) || (NAN(local_48._0_4_))) {
          uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
          uVar10 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(this->super__TPX).super_TPX.target.object,2);
          this_00 = (SGuardBuilder *)operator_new(0x28);
          MGuardBuilder::MGuardBuilder
                    ((MGuardBuilder *)this_00,period,(double)(fVar14 / local_48._0_4_),
                     uVar9 - uVar10);
        }
        else {
          uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
          uVar10 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(this->super__TPX).super_TPX.target.object,2);
          this_00 = (SGuardBuilder *)operator_new(0x28);
          AGuardBuilder::AGuardBuilder
                    ((AGuardBuilder *)this_00,period,(double)fVar15,uVar9 - uVar10);
        }
      }
      else {
        uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)cause,2);
        uVar10 = r_code::Utils::GetTimestamp<r_code::Code>
                           ((Code *)(this->super__TPX).super_TPX.target.object,2);
        this_00 = (SGuardBuilder *)operator_new(0x20);
        SGuardBuilder::SGuardBuilder(this_00,period,(period - uVar9) + uVar10);
      }
      this_01 = (Atom *)&local_4c;
LAB_0019437e:
      r_code::Atom::~Atom(this_01);
      return (GuardBuilder *)this_00;
    }
    r_code::Atom::~Atom((Atom *)&local_4c);
  }
  return (GuardBuilder *)(SGuardBuilder *)0x0;
}

Assistant:

GuardBuilder *CTPX::find_guard_builder(_Fact *cause, _Fact *consequent, uint64_t period)
{
    Code *cause_payload = cause->get_reference(0);
    uint16_t opcode = cause_payload->code(0).asOpcode();

    if (opcode == Opcodes::Cmd) { // form 0.
        float q0 = target->get_reference(0)->code(MK_VAL_VALUE).asFloat();
        float q1 = consequent->get_reference(0)->code(MK_VAL_VALUE).asFloat();
        float searched_for = q1 - q0;
        uint16_t cmd_arg_set_index = cause_payload->code(CMD_ARGS).asIndex();
        uint16_t cmd_arg_count = cause_payload->code(cmd_arg_set_index).getAtomCount();

        for (uint16_t i = 1; i <= cmd_arg_count; ++i) {
            Atom s = cause_payload->code(cmd_arg_set_index + i);

            if (!s.isFloat()) {
                continue;
            }

            float _s = s.asFloat();

            if (Utils::Equal(_s, searched_for)) {
                return new ACGuardBuilder(period, cmd_arg_set_index + i);
            }
        }

        if (q0 != 0) {
            searched_for = q1 / q0;

            for (uint16_t i = cmd_arg_set_index + 1; i <= cmd_arg_count; ++i) {
                Atom s = cause_payload->code(i);

                if (!s.isFloat()) {
                    continue;
                }

                float _s = s.asFloat();

                if (Utils::Equal(_s, searched_for)) {
                    return new MCGuardBuilder(period, i);
                }
            }
        }
    } else if (opcode == Opcodes::MkVal) {
        Atom s = cause_payload->code(MK_VAL_VALUE);

        if (s.isFloat()) {
            float _s = s.asFloat();
            float q0 = target->get_reference(0)->code(MK_VAL_VALUE).asFloat();
            float q1 = consequent->get_reference(0)->code(MK_VAL_VALUE).asFloat();
            float searched_for = (q1 - q0) / period;

            if (Utils::Equal(_s, searched_for)) { // form 1.
                uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
                return new SGuardBuilder(period, period - offset);
            }

            if (q0 != 0) { // form 2.
                uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
                return new MGuardBuilder(period, q1 / q0, offset);
            }

            uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
            return new AGuardBuilder(period, q1 - q0, offset);
        }
    }

    return nullptr;
}